

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_dependent_join.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FlattenDependentJoins::PushDownDependentJoin
          (FlattenDependentJoins *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *plan,bool propagate_null_values,idx_t lateral_depth)

{
  type op;
  undefined7 in_register_00000011;
  pointer *__ptr;
  RewriteCountAggregates aggr;
  undefined1 local_29;
  long *local_28;
  RewriteCountAggregates local_20;
  
  local_29 = (undefined1)lateral_depth;
  local_28 = *(long **)CONCAT71(in_register_00000011,propagate_null_values);
  *(undefined8 *)CONCAT71(in_register_00000011,propagate_null_values) = 0;
  PushDownDependentJoinInternal(this,plan,(bool *)&local_28,(idx_t)&local_29);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  local_28 = (long *)0x0;
  if (plan[0x16].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    RewriteCountAggregates::RewriteCountAggregates
              (&local_20,(column_binding_map_t<idx_t> *)(plan + 0x13));
    op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
         operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)this);
    LogicalOperatorVisitor::VisitOperator(&local_20.super_LogicalOperatorVisitor,op);
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> FlattenDependentJoins::PushDownDependentJoin(unique_ptr<LogicalOperator> plan,
                                                                         bool propagate_null_values,
                                                                         idx_t lateral_depth) {
	auto result = PushDownDependentJoinInternal(std::move(plan), propagate_null_values, lateral_depth);
	if (!replacement_map.empty()) {
		// check if we have to replace any COUNT aggregates into "CASE WHEN X IS NULL THEN 0 ELSE COUNT END"
		RewriteCountAggregates aggr(replacement_map);
		aggr.VisitOperator(*result);
	}
	return result;
}